

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateCBTests.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::anon_unknown_4::BlendConstantsTestInstance::~BlendConstantsTestInstance
          (BlendConstantsTestInstance *this)

{
  DynamicStateBaseClass::~DynamicStateBaseClass(&this->super_DynamicStateBaseClass);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

BlendConstantsTestInstance (Context& context, ShaderMap shaders)
		: DynamicStateBaseClass	(context, shaders[glu::SHADERTYPE_VERTEX], shaders[glu::SHADERTYPE_FRAGMENT])
	{
		m_topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		DynamicStateBaseClass::initialize();
	}